

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_asio::any_io_executor>
::reactive_socket_recv_op
          (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,state_type state,
          mutable_buffers_1 *buffers,message_flags flags,
          io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
          *handler,any_io_executor *io_ex)

{
  func_type in_RSI;
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
  *in_RDI;
  reactive_socket_recv_op_base<asio::mutable_buffers_1> *in_R8;
  undefined4 in_R9D;
  code *other;
  mutable_buffers_1 *in_stack_ffffffffffffffc8;
  state_type in_stack_ffffffffffffffd3;
  socket_type in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  
  other = do_complete;
  reactive_socket_recv_op_base<asio::mutable_buffers_1>::reactive_socket_recv_op_base
            (in_R8,(error_code *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd3,in_stack_ffffffffffffffc8,
             (message_flags)((ulong)in_RDI >> 0x20),in_RSI);
  asio::ssl::detail::
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
  ::io_op(in_RDI,(io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
                  *)other);
  handler_work<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_asio::any_io_executor,_void>
  ::handler_work((handler_work<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_asio::any_io_executor,_void>
                  *)in_RDI,
                 (io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>
                  *)other,(any_io_executor *)0x2a9122);
  return;
}

Assistant:

reactive_socket_recv_op(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state,
      const MutableBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_recv_op_base<MutableBufferSequence>(success_ec, socket,
        state, buffers, flags, &reactive_socket_recv_op::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(handler)),
      work_(handler_, io_ex)
  {
  }